

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

int FIX::number_of_symbols_in<int>(int value)

{
  undefined4 local_14;
  undefined4 local_10;
  int symbols;
  type number;
  int value_local;
  
  local_10 = _UNSIGNED_VALUE_OF<int>(value);
  local_14 = 0;
  for (; 9999 < local_10; local_10 = local_10 / 10000) {
    local_14 = local_14 + 4;
  }
  if (local_10 < 100) {
    if (local_10 < 10) {
      local_14 = local_14 + 1;
    }
    else {
      local_14 = local_14 + 2;
    }
  }
  else if (local_10 < 1000) {
    local_14 = local_14 + 3;
  }
  else {
    local_14 = local_14 + 4;
  }
  if (value < 0) {
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

inline int number_of_symbols_in(const T value) {
  typename std::make_unsigned<T>::type number = UNSIGNED_VALUE_OF(value);

  int symbols = 0;

  while (number > 9999) {
    symbols += 4;
    number /= 10000;
  }

  // small tweak to make comparison times consistent
  // always 2 comparisons instead of [1 - 4]
  if (number > 99) {
    if (number > 999) {
      symbols += 4;
    } else {
      symbols += 3;
    }
  } else {
    if (number > 9) {
      symbols += 2;
    } else {
      symbols += 1;
    }
  }

  if (value < 0) {
    symbols += 1;
  }

  return symbols;
}